

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeitems.cpp
# Opt level: O0

bool __thiscall AAmmoFillup::TryPickup(AAmmoFillup *this,AActor **toucher)

{
  PClassActor *type;
  AInventory *pAVar1;
  AInventory *item;
  PClassActor *clip;
  AActor **toucher_local;
  AAmmoFillup *this_local;
  
  type = PClass::FindActor(NAME_ClipOfBullets);
  if (type != (PClassActor *)0x0) {
    pAVar1 = AActor::FindInventory(*toucher,type,false);
    if (pAVar1 == (AInventory *)0x0) {
      pAVar1 = AActor::GiveInventoryType(*toucher,type);
      if (pAVar1 != (AInventory *)0x0) {
        pAVar1->Amount = 0x32;
      }
    }
    else {
      if (0x31 < pAVar1->Amount) {
        return false;
      }
      pAVar1->Amount = 0x32;
    }
    (*(this->super_ADummyStrifeItem).super_AInventory.super_AActor.super_DThinker.super_DObject.
      _vptr_DObject[0x36])();
  }
  return true;
}

Assistant:

bool AAmmoFillup::TryPickup (AActor *&toucher)
{
	PClassActor *clip = PClass::FindActor(NAME_ClipOfBullets);
	if (clip != NULL)
	{
		AInventory *item = toucher->FindInventory(clip);
		if (item == NULL)
		{
			item = toucher->GiveInventoryType (clip);
			if (item != NULL)
			{
				item->Amount = 50;
			}
		}
		else if (item->Amount < 50)
		{
			item->Amount = 50;
		}
		else
		{
			return false;
		}
		GoAwayAndDie ();
	}
	return true;
}